

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsAttributeLocationTests.cpp
# Opt level: O2

IterateResult __thiscall deqp::gls::MixedMaxAttributesTest::iterate(MixedMaxAttributesTest *this)

{
  deInt32 dVar1;
  deUint32 layoutLocation;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  int ndx;
  int local_284;
  AttribType *local_280;
  vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  attributes;
  vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  bindings;
  vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  noBindings;
  undefined1 local_220 [40];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  string local_1d8;
  undefined1 local_1b8 [8];
  pointer pAStack_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  deUint32 local_198;
  
  noBindings.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  noBindings.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  noBindings.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  dVar1 = anon_unknown_1::getMaxAttributeLocations(this->m_renderCtx);
  local_284 = 1;
  if (this->m_arraySize != -1) {
    local_284 = this->m_arraySize;
  }
  bindings.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bindings.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  bindings.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  attributes.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  attributes.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  attributes.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ndx = 0;
  local_1b8 = (undefined1  [8])((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pAStack_1b0);
  std::operator<<((ostream *)&pAStack_1b0,"GL_MAX_VERTEX_ATTRIBS: ");
  std::ostream::operator<<((ostringstream *)&pAStack_1b0,dVar1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pAStack_1b0);
  local_280 = &this->m_type;
  for (layoutLocation = dVar1 - (this->m_type).m_locationSize * local_284; -1 < (int)layoutLocation;
      layoutLocation = layoutLocation - (this->m_type).m_locationSize * local_284) {
    if ((ndx & 1U) == 0) {
      de::toString<int>(&local_1d8,&ndx);
      std::operator+(&local_1f8,"a_",&local_1d8);
      AttributeLocationTestUtil::Cond::Cond((Cond *)local_220,COND_ALWAYS);
      AttributeLocationTestUtil::Attribute::Attribute
                ((Attribute *)local_1b8,local_280,&local_1f8,-1,(Cond *)local_220,this->m_arraySize)
      ;
      std::
      vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
      ::emplace_back<deqp::gls::AttributeLocationTestUtil::Attribute>
                (&attributes,(Attribute *)local_1b8);
      AttributeLocationTestUtil::Attribute::~Attribute((Attribute *)local_1b8);
      std::__cxx11::string::~string((string *)(local_220 + 8));
      std::__cxx11::string::~string((string *)&local_1f8);
      std::__cxx11::string::~string((string *)&local_1d8);
      de::toString<int>(&local_1f8,&ndx);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_220,
                     "a_",&local_1f8);
      std::__cxx11::string::string((string *)local_1b8,(string *)local_220);
      local_198 = layoutLocation;
      std::
      vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
      ::emplace_back<deqp::gls::AttributeLocationTestUtil::Bind>(&bindings,(Bind *)local_1b8);
      std::__cxx11::string::~string((string *)local_1b8);
      std::__cxx11::string::~string((string *)local_220);
      this_00 = &local_1f8;
    }
    else {
      de::toString<int>(&local_1d8,&ndx);
      std::operator+(&local_1f8,"a_",&local_1d8);
      AttributeLocationTestUtil::Cond::Cond((Cond *)local_220,COND_ALWAYS);
      AttributeLocationTestUtil::Attribute::Attribute
                ((Attribute *)local_1b8,local_280,&local_1f8,layoutLocation,(Cond *)local_220,
                 this->m_arraySize);
      std::
      vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
      ::emplace_back<deqp::gls::AttributeLocationTestUtil::Attribute>
                (&attributes,(Attribute *)local_1b8);
      AttributeLocationTestUtil::Attribute::~Attribute((Attribute *)local_1b8);
      std::__cxx11::string::~string((string *)(local_220 + 8));
      std::__cxx11::string::~string((string *)&local_1f8);
      this_00 = &local_1d8;
    }
    std::__cxx11::string::~string((string *)this_00);
    ndx = ndx + 1;
  }
  local_1b8 = (undefined1  [8])0x0;
  pAStack_1b0 = (pointer)0x0;
  local_1a8._M_allocated_capacity = 0;
  AttributeLocationTestUtil::runTest
            ((this->super_TestCase).super_TestNode.m_testCtx,this->m_renderCtx,&attributes,
             &noBindings,&bindings,&noBindings,false,false,
             (vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
              *)local_1b8);
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ::~vector((vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
             *)local_1b8);
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ::~vector(&attributes);
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ::~vector(&bindings);
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ::~vector(&noBindings);
  return STOP;
}

Assistant:

tcu::TestCase::IterateResult MixedMaxAttributesTest::iterate (void)
{
	const vector<Bind>	noBindings;
	const deInt32		maxAttributes		= getMaxAttributeLocations(m_renderCtx);
	const int			arrayElementCount	= (m_arraySize != Attribute::NOT_ARRAY ? m_arraySize : 1);

	vector<Bind>		bindings;
	vector<Attribute>	attributes;
	int					ndx = 0;

	m_testCtx.getLog() << TestLog::Message << "GL_MAX_VERTEX_ATTRIBS: " << maxAttributes << TestLog::EndMessage;

	for (int loc = maxAttributes - (arrayElementCount * m_type.getLocationSize()); loc >= 0; loc -= (arrayElementCount * m_type.getLocationSize()))
	{
		if ((ndx % 2) != 0)
			attributes.push_back(Attribute(m_type, "a_" + de::toString(ndx), loc, Cond::COND_ALWAYS, m_arraySize));
		else
		{
			attributes.push_back(Attribute(m_type, "a_" + de::toString(ndx), Attribute::LOC_UNDEF, Cond::COND_ALWAYS, m_arraySize));
			bindings.push_back(Bind("a_" + de::toString(ndx), loc));

		}
		ndx++;
	}

	runTest(m_testCtx, m_renderCtx, attributes, noBindings, bindings, noBindings, false);
	return STOP;
}